

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

void YCbCrToRGBMCU(Header *header,MCU *mcu,MCU *cbcr,uint v,uint h)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint x;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  uVar4 = 0x3f;
  for (uVar5 = 7; uVar6 = 7, uVar1 = uVar4, uVar5 < 8; uVar5 = uVar5 - 1) {
    for (; uVar9 = (ulong)uVar1, uVar6 < 8; uVar6 = uVar6 - 1) {
      fVar10 = (float)(mcu->field_0).y[uVar9];
      uVar8 = (ulong)(v * 0x20 + h * 4 + (uVar5 / header->verticalSamplingFactor) * 8 +
                     (uint)(byte)(((ushort)uVar6 & 0xff) / (ushort)header->horizontalSamplingFactor)
                     );
      fVar11 = (float)*(int *)((long)&cbcr->field_2 + uVar8 * 4);
      iVar2 = (int)(fVar11 * 1.402 + fVar10 + 128.0);
      fVar12 = (float)*(int *)((long)&cbcr->field_1 + uVar8 * 4);
      iVar3 = (int)(fVar11 * -0.714 + fVar12 * -0.344 + fVar10 + 128.0);
      iVar7 = (int)(fVar12 * 1.772 + fVar10 + 128.0);
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      if (0xfe < iVar2) {
        iVar2 = 0xff;
      }
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      if (0xfe < iVar3) {
        iVar3 = 0xff;
      }
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      (mcu->field_0).y[uVar9] = iVar2;
      *(int *)((long)&mcu->field_1 + uVar9 * 4) = iVar3;
      *(int *)((long)&mcu->field_2 + uVar9 * 4) = iVar7;
      uVar1 = uVar1 - 1;
    }
    uVar4 = uVar4 - 8;
  }
  return;
}

Assistant:

void YCbCrToRGBMCU(const Header* const header, MCU& mcu, const MCU& cbcr, const uint v, const uint h) {
	//从bottom-right to top-left
	for (uint y = 7; y < 8; y--) {
		for (uint x = 7; x < 8; x--) {
			//chroma 分量用了第一个block的
			//luminance 分量不变
			const uint pixel = y * 8 + x;
			const uint cbcrPixelRow = y / header->verticalSamplingFactor + 4 * v;
			const uint cbcrPixelColumn = x / header->horizontalSamplingFactor + 4 * h;
			const uint cbcrPixel = cbcrPixelRow * 8 + cbcrPixelColumn;
			int r = mcu.y[pixel]  						       + 1.402f * cbcr.cr[cbcrPixel] + 128;
			int g = mcu.y[pixel] - 0.344f * cbcr.cb[cbcrPixel] - 0.714f * cbcr.cr[cbcrPixel] + 128;
			int b = mcu.y[pixel] + 1.772f * cbcr.cb[cbcrPixel] 							     + 128;
			r = r < 0 ? 0 : r;
			r = r > 255 ? 255 : r;
			g = g < 0 ? 0 : g;
			g = g > 255 ? 255 : g;
			b = b < 0 ? 0 : b;
			b = b > 255 ? 255 : b;
			mcu.r[pixel] = r;
			mcu.g[pixel] = g;
			mcu.b[pixel] = b;
		}
	}
	

}